

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_write_siz(opj_j2k_t *j2k)

{
  opj_cio_t *cio_00;
  int pos;
  int iVar1;
  long in_RDI;
  opj_cp_t *cp;
  opj_image_t *image;
  opj_cio_t *cio;
  int len;
  int lenp;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  unsigned_short type;
  opj_codestream_info_t *cstr_info;
  opj_cio_t *cio_01;
  uint local_c;
  
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  cio_01 = *(opj_cio_t **)(in_RDI + 0x58);
  cstr_info = *(opj_codestream_info_t **)(in_RDI + 0x60);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  pos = cio_tell(cio_00);
  cio_skip(cio_00,2);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  for (local_c = 0; local_c < *(uint *)&cio_01->buffer; local_c = local_c + 1) {
    cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
    cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
    cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  }
  iVar1 = cio_tell(cio_00);
  cio_seek(cio_00,pos);
  cio_write(cio_01,(unsigned_long_long)cstr_info,in_stack_ffffffffffffffcc);
  type = (unsigned_short)((uint)in_stack_ffffffffffffffcc >> 0x10);
  cio_seek(cio_00,pos + (iVar1 - pos));
  if (*(long *)(in_RDI + 0x68) != 0) {
    j2k_add_mhmarker(cstr_info,type,in_stack_ffffffffffffffc8,0);
  }
  return;
}

Assistant:

static void j2k_write_siz(opj_j2k_t *j2k) {
	int i;
	int lenp, len;

	opj_cio_t *cio = j2k->cio;
	opj_image_t *image = j2k->image;
	opj_cp_t *cp = j2k->cp;

	cio_write(cio, J2K_MS_SIZ, 2);	/* SIZ */
	lenp = cio_tell(cio);
	cio_skip(cio, 2);
	cio_write(cio, cp->rsiz, 2);			/* Rsiz (capabilities) */
	cio_write(cio, image->x1, 4);	/* Xsiz */
	cio_write(cio, image->y1, 4);	/* Ysiz */
	cio_write(cio, image->x0, 4);	/* X0siz */
	cio_write(cio, image->y0, 4);	/* Y0siz */
	cio_write(cio, cp->tdx, 4);		/* XTsiz */
	cio_write(cio, cp->tdy, 4);		/* YTsiz */
	cio_write(cio, cp->tx0, 4);		/* XT0siz */
	cio_write(cio, cp->ty0, 4);		/* YT0siz */
	cio_write(cio, image->numcomps, 2);	/* Csiz */
	for (i = 0; i < image->numcomps; i++) {
		cio_write(cio, image->comps[i].prec - 1 + (image->comps[i].sgnd << 7), 1);	/* Ssiz_i */
		cio_write(cio, image->comps[i].dx, 1);	/* XRsiz_i */
		cio_write(cio, image->comps[i].dy, 1);	/* YRsiz_i */
	}
	len = cio_tell(cio) - lenp;
	cio_seek(cio, lenp);
	cio_write(cio, len, 2);		/* Lsiz */
	cio_seek(cio, lenp + len);
	
	if(j2k->cstr_info)
	  j2k_add_mhmarker(j2k->cstr_info, J2K_MS_SIZ, lenp, len);
}